

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  size_type sVar4;
  Message env_var;
  string full_flag;
  char local_49;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string local_40;
  
  Message::Message((Message *)&local_48);
  sVar3 = 6;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_48.ptr_ + 0x10),"gtest_",6);
  poVar2 = (ostream *)(local_48.ptr_ + 0x10);
  if (this == (internal *)0x0) {
    this = (internal *)"(null)";
  }
  else {
    sVar3 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)this,sVar3);
  StringStreamToString(&local_40,local_48.ptr_);
  if (local_48.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_48.ptr_ + 8))();
    local_48.ptr_ = (stringstream *)0x0;
  }
  Message::Message((Message *)&local_48);
  if (local_40._M_string_length != 0) {
    sVar4 = 0;
    do {
      iVar1 = toupper((uint)(byte)local_40._M_dataplus._M_p[sVar4]);
      local_49 = (char)iVar1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_48.ptr_ + 0x10),&local_49,1);
      sVar4 = sVar4 + 1;
    } while (sVar4 != local_40._M_string_length);
  }
  StringStreamToString(__return_storage_ptr__,local_48.ptr_);
  if (local_48.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_48.ptr_ + 8))();
    local_48.ptr_ = (stringstream *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}